

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O3

token * dmrC_get_string_constant(dmr_C *C,token *token,expression *expr)

{
  uint uVar1;
  expression *peVar2;
  long lVar3;
  uint *puVar4;
  string *psVar5;
  uint *end;
  string sVar6;
  int iVar7;
  position pVar8;
  ulong uVar9;
  int iVar10;
  undefined1 local_2068 [8];
  char buffer [8191];
  undefined1 local_58 [4];
  int local_54;
  uint v;
  string *local_48;
  dmr_C *local_40;
  uint local_34;
  
  local_48 = (token->field_2).string;
  pVar8 = (position)token->next;
  local_34 = (uint)(((ulong)token->pos & 0x3f) == 0x10);
  do {
    if ((*(uint *)pVar8 & 0x3f) != 0xf) {
      if ((*(uint *)pVar8 & 0x3f) != 0x10) break;
      local_34 = 1;
    }
    pVar8 = *(position *)((long)pVar8 + 8);
  } while( true );
  lVar3 = 0x30;
  if (local_34 == 0) {
    lVar3 = 0x18;
  }
  _v = expr;
  local_40 = C;
  if (pVar8 == (position)token) {
    sVar6 = *local_48;
    iVar7 = 0;
LAB_00107bd6:
    if (iVar7 < (int)((uint)sVar6 & 0x7fffffff)) goto LAB_00107c59;
  }
  else {
    local_54 = *(int *)((long)&C->target->size_t_ctype + lVar3);
    iVar10 = 0;
    uVar9 = 0;
    do {
      puVar4 = *(uint **)((long)token + 0x10);
      if (1 < (*puVar4 & 0x7fffffff)) {
        end = (uint *)((long)puVar4 + (ulong)(*puVar4 & 0x7fffffff) + 3);
        puVar4 = puVar4 + 1;
        uVar9 = (ulong)(int)uVar9;
        unique0x10000207 = (position)token;
        do {
          uVar1 = *puVar4;
          puVar4 = (uint *)parse_escape(local_40,(char *)puVar4,(uint *)local_58,(char *)end,
                                        local_54,*(position *)stack0xffffffffffffff98);
          if ((long)uVar9 < 0x1fff) {
            local_2068[uVar9] = local_58[0];
          }
          iVar10 = iVar10 + (uint)((char)uVar1 == '\\');
          uVar9 = uVar9 + 1;
          token = (token *)stack0xffffffffffffff98;
        } while (puVar4 < end);
      }
      iVar7 = (int)uVar9;
      token = *(token **)((long)token + 8);
    } while ((position)token != pVar8);
    if (iVar7 < 0x2000) {
      sVar6 = *local_48;
    }
    else {
      dmrC_warning(local_40,token->pos,"trying to concatenate %d-character string (%d bytes max)",
                   uVar9 & 0xffffffff,0x1fff);
      sVar6 = *local_48;
      iVar7 = 0x1fff;
    }
    if (iVar10 == 0) goto LAB_00107bd6;
  }
  if (((int)sVar6 < 0) || (psVar5 = local_48, (int)sVar6 <= iVar7)) {
    psVar5 = (string *)dmrC_allocator_allocate(&local_40->string_allocator,(long)(iVar7 + 1));
    sVar6 = *psVar5;
  }
  uVar1 = local_34;
  peVar2 = _v;
  *psVar5 = (string)((uint)sVar6 & 0x80000000 | iVar7 + 1U & 0x7fffffff);
  memcpy(psVar5 + 1,local_2068,(long)iVar7);
  *(undefined1 *)((long)&psVar5[1].field_0x0 + (long)iVar7) = 0;
  local_48 = psVar5;
  _v = peVar2;
  local_34 = uVar1;
LAB_00107c59:
  (_v->field_5).field_2.string = local_48;
  (_v->field_5).field_2.wide = local_34;
  return (token *)(position)token;
}

Assistant:

struct token *dmrC_get_string_constant(struct dmr_C *C, struct token *token, struct expression *expr)
{
	struct string *string = token->string;
	struct token *next = token->next, *done = NULL;
	int stringtype = dmrC_token_type(token);
	int is_wide = stringtype == TOKEN_WIDE_STRING;
	char buffer[MAX_STRING];
	int len = 0;
	int bits;
	int esc_count = 0;

	while (!done) {
		switch (dmrC_token_type(next)) {
		case TOKEN_WIDE_STRING:
			is_wide = 1;
		case TOKEN_STRING:
			next = next->next;
			break;
		default:
			done = next;
		}
	}
	bits = is_wide ? C->target->bits_in_wchar : C->target->bits_in_char;
	while (token != done) {
		unsigned v;
		const char *p = token->string->data;
		const char *end = p + token->string->length - 1;
		while (p < end) {
			if (*p == '\\')
				esc_count++;
			p = parse_escape(C, p, &v, end, bits, token->pos);
			if (len < MAX_STRING)
				buffer[len] = v;
			len++;
		}
		token = token->next;
	}
	if (len > MAX_STRING) {
		dmrC_warning(C, token->pos, "trying to concatenate %d-character string (%d bytes max)", len, MAX_STRING);
		len = MAX_STRING;
	}

	if (esc_count || len >= (int)string->length) {
		if (string->immutable || len >= string->length)	/* can't cannibalize */
			string = (struct string *)dmrC_allocator_allocate(&C->string_allocator, len+1);
		string->length = len+1;
		memcpy(string->data, buffer, len);
		string->data[len] = '\0';
	}
	expr->string = string;
	expr->wide = is_wide;
	return token;
}